

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::emit_patch_variables(Impl *this)

{
  ExecutionModel EVar1;
  ResourceRemappingInterface *pRVar2;
  char cVar3;
  bool bVar4;
  ComponentType element_type;
  bool bVar5;
  bool bVar6;
  MetadataKind MVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Id IVar11;
  Id IVar12;
  int iVar13;
  MDOperand *pMVar14;
  MDNode *pMVar15;
  Module *module;
  Builder *this_00;
  undefined4 extraout_var;
  MDNode *node;
  mapped_type *pmVar16;
  LoggingCallback p_Var17;
  void *pvVar18;
  byte bVar19;
  ulong in_RCX;
  Decoration decoration;
  char cVar20;
  StorageClass storage;
  ComponentType type;
  BuiltIn builtin;
  MDNode *pMVar21;
  uint element_id;
  VulkanStageIO vk_io;
  String variable_name;
  String semantic_name;
  D3DStageIO d3d_io;
  uint local_10f4;
  uint local_10f0;
  uint local_10cc;
  MDNode *local_10c8;
  uint local_10bc;
  uint local_10b8;
  uint local_10b4;
  undefined8 local_10b0;
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  char local_10a0 [16];
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1090;
  MDNode *local_1088;
  undefined8 local_1080;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_1078;
  String local_1058;
  uint *local_1038;
  uint uStack_1030;
  uint uStack_102c;
  uint uStack_1028;
  undefined4 uStack_1024;
  undefined5 uStack_1020;
  
  pMVar15 = this->entry_point_meta;
  pMVar14 = LLVMBC::MDNode::getOperand(pMVar15,2);
  if (pMVar14->kind != None) {
    pMVar15 = (MDNode *)LLVMBC::MDNode::getOperand(pMVar15,2);
    MVar7 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)pMVar15);
    if (MVar7 != Node) {
      p_Var17 = get_thread_log_callback();
      if (p_Var17 == (LoggingCallback)0x0) {
        emit_patch_variables();
        std::terminate();
      }
LAB_0011c670:
      uStack_1028 = 0x63206e69;
      uStack_1024 = 0x3c747361;
      uStack_1020 = 0xa2e3e54;
      local_1038 = (uint *)0x2064696c61766e49;
      uStack_1030 = 0x65707974;
      uStack_102c = 0x20444920;
      pvVar18 = get_thread_log_callback_userdata();
      (*p_Var17)(pvVar18,Error,(char *)&local_1038);
      std::terminate();
    }
    pMVar15 = (MDNode *)LLVMBC::MDNode::getOperand(pMVar15,2);
    if ((pMVar15->super_MDOperand).kind != None) {
      if (this->execution_model == ExecutionModelTessellationControl) {
        module = LLVMBCParser::get_module(this->bitcode_parser);
        bVar4 = module_is_dxilconv(module);
      }
      else {
        bVar4 = false;
      }
      MVar7 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)pMVar15);
      pMVar21 = (MDNode *)0x0;
      if (MVar7 != Node) {
        pMVar15 = pMVar21;
      }
      this_00 = SPIRVModule::get_builder(this->spirv_module);
      EVar1 = this->execution_model;
      uVar8 = LLVMBC::MDNode::getNumOperands(pMVar15);
      if (uVar8 != 0) {
        storage = (uint)(EVar1 != ExecutionModelTessellationEvaluation) * 2 + StorageClassInput;
        local_1090 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->patch_elements_meta;
        local_10f0 = 0;
        local_10c8 = pMVar15;
        do {
          uVar8 = (uint)in_RCX;
          pMVar15 = (MDNode *)LLVMBC::MDNode::getOperand(pMVar15,(uint)pMVar21);
          MVar7 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)pMVar15);
          if (MVar7 != Node) {
            p_Var17 = get_thread_log_callback();
            if (p_Var17 == (LoggingCallback)0x0) {
              emit_patch_variables();
              std::terminate();
            }
            goto LAB_0011c670;
          }
          local_10f4 = 0;
          local_10cc = get_constant_metadata<unsigned_int>(pMVar15,0);
          get_string_metadata_abi_cxx11_(&local_1058,(dxil_spv *)pMVar15,(MDNode *)0x1,uVar8);
          uVar8 = get_constant_metadata<unsigned_int>(pMVar15,2);
          bVar19 = (ComponentType)uVar8 - SNormF16;
          type = (ComponentType)(0xa0a09090808 >> (bVar19 * '\b' & 0x3f));
          if (5 < bVar19) {
            type = (ComponentType)uVar8;
          }
          element_type = get_effective_input_output_type(this,type);
          uVar8 = get_constant_metadata<unsigned_int>(pMVar15,3);
          local_1080 = CONCAT44(extraout_var,uVar8);
          pMVar14 = LLVMBC::MDNode::getOperand(pMVar15,4);
          if (pMVar14->kind != None) {
            node = (MDNode *)LLVMBC::MDNode::getOperand(pMVar15,4);
            MVar7 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)node);
            if (MVar7 != Node) {
              p_Var17 = get_thread_log_callback();
              if (p_Var17 == (LoggingCallback)0x0) {
                emit_patch_variables();
                std::terminate();
              }
              goto LAB_0011c670;
            }
            local_10f4 = get_constant_metadata<unsigned_int>(node,0);
          }
          uVar9 = get_constant_metadata<unsigned_int>(pMVar15,6);
          local_10b8 = get_constant_metadata<unsigned_int>(pMVar15,7);
          uVar10 = get_constant_metadata<unsigned_int>(pMVar15,8);
          local_10b4 = get_constant_metadata<unsigned_int>(pMVar15,9);
          cVar20 = (char)local_1080;
          in_RCX = 2;
          uVar8 = uVar9;
          if (cVar20 == '\x1a') {
            uVar8 = 2;
          }
          if (cVar20 == '\x19') {
            uVar8 = 4;
          }
          bVar5 = (bool)(cVar20 == '\0' & bVar4);
          local_10bc = uVar9;
          local_1088 = pMVar21;
          if (bVar5 == true) {
            if (local_10f0 <= uVar10 + uVar9) {
              local_10f0 = uVar10 + uVar9;
            }
            pmVar16 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_1090,&local_10cc);
LAB_0011c15f:
            IVar11 = get_type_id(this,element_type,uVar8,local_10b8,false);
LAB_0011c17d:
            if (this->execution_model == ExecutionModelMeshEXT) {
              uVar8 = (this->execution_mode_meta).stage_output_num_primitive;
              IVar12 = spv::Builder::makeIntegerType(this_00,0x20,false);
              IVar12 = spv::Builder::makeIntConstant(this_00,IVar12,uVar8,false);
              IVar11 = spv::Builder::makeArrayType(this_00,IVar11,IVar12,0);
            }
            pMVar15 = local_10c8;
            local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
            std::__cxx11::
            basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                                 *)&local_1078,local_1058._M_dataplus._M_p,
                                local_1058._M_dataplus._M_p + local_1058._M_string_length);
            if (local_10f4 != 0) {
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              append(&local_1078,"_");
              cVar20 = '\x01';
              if (9 < local_10f4) {
                uVar8 = local_10f4;
                cVar3 = '\x04';
                do {
                  cVar20 = cVar3;
                  if (uVar8 < 100) {
                    cVar20 = cVar20 + -2;
                    goto LAB_0011c332;
                  }
                  if (uVar8 < 1000) {
                    cVar20 = cVar20 + -1;
                    goto LAB_0011c332;
                  }
                  if (uVar8 < 10000) goto LAB_0011c332;
                  bVar6 = 99999 < uVar8;
                  uVar8 = uVar8 / 10000;
                  cVar3 = cVar20 + '\x04';
                } while (bVar6);
                cVar20 = cVar20 + '\x01';
              }
LAB_0011c332:
              local_1038 = &uStack_1028;
              std::__cxx11::string::_M_construct((ulong)&local_1038,cVar20);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_1038,uStack_1030,local_10f4);
              local_10b0 = local_10a0;
              std::__cxx11::
              basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
              _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                          *)&local_10b0,local_1038,
                         (long)local_1038 + CONCAT44(uStack_102c,uStack_1030));
              if (local_1038 != &uStack_1028) {
                operator_delete(local_1038,CONCAT44(uStack_1024,uStack_1028) + 1);
              }
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              _M_append(&local_1078,local_10b0,CONCAT44(uStack_10a4,local_10a8));
              if (local_10b0 != local_10a0) {
                free_in_thread(local_10b0);
              }
            }
            IVar11 = SPIRVModule::create_variable
                               (this->spirv_module,storage,IVar11,local_1078._M_dataplus._M_p);
            (pmVar16->super_ElementMeta).id = IVar11;
            (pmVar16->super_ElementMeta).component_type = type;
            (pmVar16->super_ElementMeta).semantic_offset = 0;
            pmVar16->start_row = uVar10;
            pmVar16->start_col = local_10b4;
            pmVar16->lowering = bVar5;
            if ((Semantic)local_1080 == User) {
              uVar8 = this->patch_location_offset + uVar10;
              in_RCX = (ulong)uVar8;
              local_10b0 = (char *)CONCAT44(local_10b4,uVar8);
              local_10a8 = 1;
              pRVar2 = this->resource_mapping_iface;
              if (pRVar2 == (ResourceRemappingInterface *)0x0) {
LAB_0011c4d6:
                spv::Builder::addDecoration(this_00,IVar11,DecorationLocation,uVar8);
                if (local_10b0._4_4_ != 0) {
                  spv::Builder::addDecoration(this_00,IVar11,DecorationComponent,local_10b0._4_4_);
                }
                goto LAB_0011c4fe;
              }
              local_1038 = (uint *)local_1058._M_dataplus._M_p;
              uStack_1030 = local_10f4;
              uStack_1028 = local_10bc;
              uStack_102c = uVar10;
              if (this->execution_model == ExecutionModelTessellationEvaluation) {
                iVar13 = (*pRVar2->_vptr_ResourceRemappingInterface[8])();
                cVar20 = (char)iVar13;
              }
              else {
                iVar13 = (*pRVar2->_vptr_ResourceRemappingInterface[9])
                                   (pRVar2,&local_1038,&local_10b0);
                cVar20 = (char)iVar13;
              }
              if (cVar20 != '\0') {
                uVar8 = (uint)local_10b0;
                goto LAB_0011c4d6;
              }
              bVar5 = true;
            }
            else {
              emit_builtin_decoration(this,IVar11,(Semantic)local_1080,storage);
LAB_0011c4fe:
              decoration = DecorationPatch;
              if (this->execution_model == ExecutionModelMeshEXT) {
                decoration = DecorationPerPrimitiveEXT;
              }
              in_RCX = 0xffffffff;
              spv::Builder::addDecoration(this_00,IVar11,decoration,-1);
              bVar5 = false;
            }
            iVar13 = (int)local_1088;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
                 *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
              free_in_thread(local_1078._M_dataplus._M_p);
            }
          }
          else {
            pmVar16 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_1090,&local_10cc);
            if (1 < (byte)(cVar20 - 0x19U)) {
              if (cVar20 != '\x1e') goto LAB_0011c15f;
              IVar11 = spv::Builder::makeBoolType(this_00);
              goto LAB_0011c17d;
            }
            builtin = (cVar20 != '\x19') + BuiltInTessLevelOuter;
            bVar6 = SPIRVModule::has_builtin_shader_input(this->spirv_module,builtin);
            if (!bVar6) goto LAB_0011c15f;
            (pmVar16->super_ElementMeta).id = 0;
            (pmVar16->super_ElementMeta).component_type = Invalid;
            *(undefined3 *)&(pmVar16->super_ElementMeta).field_0x5 = 0;
            *(undefined8 *)&(pmVar16->super_ElementMeta).semantic_offset = 0;
            *(undefined8 *)((long)&pmVar16->start_row + 1) = 0;
            IVar11 = SPIRVModule::get_builtin_shader_input(this->spirv_module,builtin);
            (pmVar16->super_ElementMeta).id = IVar11;
            (pmVar16->super_ElementMeta).component_type = type;
            (pmVar16->super_ElementMeta).semantic_offset = uVar10;
            bVar5 = false;
            iVar13 = (int)local_1088;
            pMVar15 = local_10c8;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
            free_in_thread(local_1058._M_dataplus._M_p);
          }
          if (bVar5) {
            return false;
          }
          pMVar21 = (MDNode *)(ulong)(iVar13 + 1U);
          uVar8 = LLVMBC::MDNode::getNumOperands(pMVar15);
        } while (iVar13 + 1U < uVar8);
        if (local_10f0 != 0) {
          IVar11 = spv::Builder::makeIntegerType(this_00,0x20,false);
          IVar11 = spv::Builder::makeVectorType(this_00,IVar11,4);
          IVar12 = spv::Builder::makeIntegerType(this_00,0x20,false);
          IVar12 = spv::Builder::makeIntConstant(this_00,IVar12,local_10f0,false);
          IVar11 = spv::Builder::makeArrayType(this_00,IVar11,IVar12,0);
          IVar12 = spv::Builder::makeNullConstant(this_00,IVar11);
          IVar11 = SPIRVModule::create_variable_with_initializer
                             (this->spirv_module,StorageClassPrivate,IVar11,IVar12,
                              "PatchLoweringRows");
          (this->execution_mode_meta).patch_lowering_array_var_id = IVar11;
        }
      }
    }
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_patch_variables()
{
	auto *node = entry_point_meta;

	if (!node->getOperand(2))
		return true;

	auto &signature = node->getOperand(2);
	auto *signature_node = llvm::cast<llvm::MDNode>(signature);
	auto &patch_variables = signature_node->getOperand(2);
	if (!patch_variables)
		return true;

	// dxilconv is broken and emits patch the fork phase in a way that is non-sensical.
	// It assumes that you can write outside the bounds of a signature element.
	// To make this work, we need to lower the patch constant variables from Private variables instead.
	bool broken_patch_variables = false;
	if (execution_model == spv::ExecutionModelTessellationControl)
		broken_patch_variables = module_is_dxilconv(bitcode_parser.get_module());

	auto *patch_node = llvm::dyn_cast<llvm::MDNode>(patch_variables);

	auto &builder = spirv_module.get_builder();

	spv::StorageClass storage =
	    execution_model == spv::ExecutionModelTessellationEvaluation ? spv::StorageClassInput : spv::StorageClassOutput;

	unsigned num_broken_user_rows = 0;

	for (unsigned i = 0; i < patch_node->getNumOperands(); i++)
	{
		auto *patch = llvm::cast<llvm::MDNode>(patch_node->getOperand(i));
		auto element_id = get_constant_metadata(patch, 0);
		auto semantic_name = get_string_metadata(patch, 1);
		auto actual_element_type = normalize_component_type(static_cast<DXIL::ComponentType>(get_constant_metadata(patch, 2)));
		auto effective_element_type = get_effective_input_output_type(actual_element_type);
		auto system_value = static_cast<DXIL::Semantic>(get_constant_metadata(patch, 3));

		unsigned semantic_index = 0;
		if (patch->getOperand(4))
			semantic_index = get_constant_metadata(llvm::cast<llvm::MDNode>(patch->getOperand(4)), 0);

		auto rows = get_constant_metadata(patch, 6);
		auto cols = get_constant_metadata(patch, 7);

		auto start_row = get_constant_metadata(patch, 8);
		auto start_col = get_constant_metadata(patch, 9);

		if (system_value == DXIL::Semantic::TessFactor)
			rows = 4;
		else if (system_value == DXIL::Semantic::InsideTessFactor)
			rows = 2;

		if (broken_patch_variables && system_value == DXIL::Semantic::User)
			num_broken_user_rows = std::max<unsigned>(num_broken_user_rows, start_row + rows);

		auto &meta = patch_elements_meta[element_id];

		// Handle case where shader declares the tess factors twice at different offsets.
		unsigned semantic_offset = 0;
		if (system_value == DXIL::Semantic::TessFactor || system_value == DXIL::Semantic::InsideTessFactor)
		{
			auto builtin = system_value == DXIL::Semantic::TessFactor ?
			               spv::BuiltInTessLevelOuter : spv::BuiltInTessLevelInner;
			if (spirv_module.has_builtin_shader_input(builtin))
			{
				meta = {};
				meta.id = spirv_module.get_builtin_shader_input(builtin);
				meta.component_type = actual_element_type;
				meta.semantic_offset = start_row;
				continue;
			}
		}

		spv::Id type_id;

		if (system_value == DXIL::Semantic::CullPrimitive)
			type_id = builder.makeBoolType();
		else
			type_id = get_type_id(effective_element_type, rows, cols);

		if (execution_model == spv::ExecutionModelMeshEXT)
		{
			type_id = builder.makeArrayType(
				type_id, builder.makeUintConstant(execution_mode_meta.stage_output_num_primitive, false), 0);
		}

		auto variable_name = semantic_name;
		if (semantic_index != 0)
		{
			variable_name += "_";
			variable_name += dxil_spv::to_string(semantic_index);
		}

		spv::Id variable_id = create_variable(storage, type_id, variable_name.c_str());
		meta.id = variable_id;
		meta.component_type = actual_element_type;
		meta.semantic_offset = semantic_offset;
		meta.start_row = start_row;
		meta.start_col = start_col;
		meta.lowering = broken_patch_variables && system_value == DXIL::Semantic::User;

		if (system_value != DXIL::Semantic::User)
		{
			emit_builtin_decoration(variable_id, system_value, storage);
		}
		else
		{
			// Patch constants are packed together with control point variables,
			// so we need to apply an offset to make this work in SPIR-V.
			// The offset is deduced from the control point I/O signature.
			// TODO: If it's possible to omit trailing CP members in domain shader, we will need to pass this offset
			// into the compiler.
			VulkanStageIO vk_io = { start_row + patch_location_offset, start_col, true };

			if (resource_mapping_iface)
			{
				D3DStageIO d3d_io = { semantic_name.c_str(), semantic_index, start_row, rows };

				if (execution_model == spv::ExecutionModelTessellationEvaluation)
				{
					if (!resource_mapping_iface->remap_stage_input(d3d_io, vk_io))
						return false;
				}
				else if (!resource_mapping_iface->remap_stage_output(d3d_io, vk_io))
					return false;
			}

			builder.addDecoration(variable_id, spv::DecorationLocation, vk_io.location);
			if (vk_io.component != 0)
				builder.addDecoration(variable_id, spv::DecorationComponent, vk_io.component);
		}

		builder.addDecoration(variable_id, execution_model == spv::ExecutionModelMeshEXT
		                                   ? spv::DecorationPerPrimitiveEXT : spv::DecorationPatch);
	}

	if (num_broken_user_rows)
	{
		spv::Id type_id = builder.makeArrayType(builder.makeVectorType(builder.makeUintType(32), 4),
		                                        builder.makeUintConstant(num_broken_user_rows), 0);
		execution_mode_meta.patch_lowering_array_var_id =
			create_variable_with_initializer(spv::StorageClassPrivate, type_id,
			                                 builder.makeNullConstant(type_id),
			                                 "PatchLoweringRows");
	}

	return true;
}